

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O0

adios2_engine * adios2_open_with_metadata(adios2_io *io,char *name,char *md,size_t mdsize)

{
  adios2_engine *paVar1;
  adios2_io *in_RCX;
  ulong in_RDX;
  char *in_RSI;
  string *in_RDI;
  adios2_engine *engine;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  string *hint;
  
  hint = (string *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_48,"for adios2_io, in call to adios2_open_with_metadata",&local_49);
  adios2::helper::CheckForNullptr<adios2_io>(in_RCX,hint);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,in_RSI,&local_81);
  paVar1 = (adios2_engine *)adios2::core::IO::Open(in_RDI,(char *)local_80,in_RDX);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return paVar1;
}

Assistant:

adios2_engine *adios2_open_with_metadata(adios2_io *io, const char *name, const char *md,
                                         const size_t mdsize)
{
    adios2_engine *engine = nullptr;
    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_open_with_metadata");
        engine = reinterpret_cast<adios2_engine *>(
            &reinterpret_cast<adios2::core::IO *>(io)->Open(name, md, mdsize));
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_open_with_metadata");
    }
    return engine;
}